

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O0

uint64_t helper_punpckhhw_mips64(uint64_t fs,uint64_t ft)

{
  undefined2 uStack_34;
  undefined2 uStack_32;
  LMIValue vt;
  LMIValue vs;
  LMIValue vd;
  uint host;
  uint64_t ft_local;
  uint64_t fs_local;
  
  vt.uh[2] = (uint16_t)(fs >> 0x20);
  vs.uh[0] = vt.uh[2];
  uStack_34 = (uint16_t)(ft >> 0x20);
  vs.uh[1] = uStack_34;
  vt.uh[3] = (uint16_t)(fs >> 0x30);
  vs.uh[2] = vt.uh[3];
  uStack_32 = (uint16_t)(ft >> 0x30);
  vs.uh[3] = uStack_32;
  return vs.d;
}

Assistant:

uint64_t helper_punpckhhw(uint64_t fs, uint64_t ft)
{
    unsigned host = BYTE_ORDER_XOR(3);
    LMIValue vd, vs, vt;

    vs.d = fs;
    vt.d = ft;
    vd.uh[0 ^ host] = vs.uh[2 ^ host];
    vd.uh[1 ^ host] = vt.uh[2 ^ host];
    vd.uh[2 ^ host] = vs.uh[3 ^ host];
    vd.uh[3 ^ host] = vt.uh[3 ^ host];

    return vd.d;
}